

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O2

int MPIABI_Status_c2f(MPIABI_Status *c_status,MPIABI_Fint *f_status)

{
  int iVar1;
  WPI_const_StatusPtr local_10;
  
  local_10.wrapped_status_ptr = (WPI_Status *)c_status;
  iVar1 = MPI_Status_c2f();
  WPI_const_StatusPtr::~WPI_const_StatusPtr(&local_10);
  return iVar1;
}

Assistant:

int MPIABI_Status_c2f(
  const MPIABI_Status * c_status,
  MPIABI_Fint * f_status
) {
  return MPI_Status_c2f(
    (const MPI_Status *)(WPI_const_StatusPtr)c_status,
    (MPI_Fint *)(WPI_Fint *)f_status
  );
}